

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Market.cpp
# Opt level: O2

void __thiscall Market::erase(Market *this,Order *order)

{
  __type_conflict _Var1;
  iterator __position;
  iterator __position_00;
  string id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)order);
  if (order->m_side == sell) {
    for (__position_00._M_node =
              (this->m_askOrders)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)__position_00._M_node !=
        &(this->m_askOrders)._M_t._M_impl.super__Rb_tree_header;
        __position_00._M_node = (_Base_ptr)std::_Rb_tree_increment(__position_00._M_node)) {
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &__position_00._M_node[1]._M_parent,&local_40);
      if (_Var1) {
        std::
        _Rb_tree<double,std::pair<double_const,Order>,std::_Select1st<std::pair<double_const,Order>>,std::less<double>,std::allocator<std::pair<double_const,Order>>>
        ::erase_abi_cxx11_((_Rb_tree<double,std::pair<double_const,Order>,std::_Select1st<std::pair<double_const,Order>>,std::less<double>,std::allocator<std::pair<double_const,Order>>>
                            *)&this->m_askOrders,__position_00);
        break;
      }
    }
  }
  else if (order->m_side == buy) {
    for (__position._M_node =
              (this->m_bidOrders)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)__position._M_node !=
        &(this->m_bidOrders)._M_t._M_impl.super__Rb_tree_header;
        __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node)) {
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &__position._M_node[1]._M_parent,&local_40);
      if (_Var1) {
        std::
        _Rb_tree<double,std::pair<double_const,Order>,std::_Select1st<std::pair<double_const,Order>>,std::greater<double>,std::allocator<std::pair<double_const,Order>>>
        ::erase_abi_cxx11_((_Rb_tree<double,std::pair<double_const,Order>,std::_Select1st<std::pair<double_const,Order>>,std::greater<double>,std::allocator<std::pair<double_const,Order>>>
                            *)&this->m_bidOrders,__position);
        break;
      }
    }
  }
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void Market::erase(const Order &order) {
  std::string id = order.getClientID();
  if (order.getSide() == Order::buy) {
    BidOrders::iterator i;
    for (i = m_bidOrders.begin(); i != m_bidOrders.end(); ++i) {
      if (i->second.getClientID() == id) {
        m_bidOrders.erase(i);
        return;
      }
    }
  } else if (order.getSide() == Order::sell) {
    AskOrders::iterator i;
    for (i = m_askOrders.begin(); i != m_askOrders.end(); ++i) {
      if (i->second.getClientID() == id) {
        m_askOrders.erase(i);
        return;
      }
    }
  }
}